

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_2::InputFile,Imf_3_2::OutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  MultiPartInputFile file_1;
  OutputFile file;
  Header f;
  MultiPartInputFile aMStack_88 [16];
  long *local_78;
  long local_70;
  long local_68 [2];
  Header local_58 [56];
  
  local_78 = (long *)0x0;
  Imf_3_2::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar5 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_78,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar5,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012f7ef;
    }
  }
  else {
LAB_0012f7ef:
    Imf_3_2::Header::setType((string *)local_58);
  }
  puVar6 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar6 = 2;
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)&local_78,"/var/tmp/badfile.exr",local_58,iVar3);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)&local_78);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(aMStack_88,"/var/tmp/badfile.exr",iVar3,true);
  sVar1 = inputtype->_M_string_length;
  iVar3 = (int)aMStack_88;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar4 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar4 != 0) goto LAB_0012f887;
    }
  }
  else {
LAB_0012f887:
    Imf_3_2::MultiPartInputFile::header(iVar3);
    puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar7[1];
    if (sVar1 == inputtype->_M_string_length) {
      if (sVar1 != 0) {
        iVar4 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
        if (iVar4 != 0) goto LAB_0012f8bf;
      }
    }
    else {
LAB_0012f8bf:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                          inputtype->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," but got ",9);
      Imf_3_2::MultiPartInputFile::header(iVar3);
      puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)*puVar7,puVar7[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001eeea0) {
        if (sVar1 != 0) {
          iVar4 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar4 != 0) goto LAB_0012f961;
        }
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
      }
      else {
LAB_0012f961:
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_78,local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
    }
  }
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar4 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar4 != 0) goto LAB_0012fa1c;
    }
  }
  else {
LAB_0012fa1c:
    Imf_3_2::MultiPartInputFile::header(iVar3);
    puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar7[1];
    if (sVar1 != inputtype->_M_string_length) {
LAB_0012fca3:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::OutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
      if (iVar3 != 0) goto LAB_0012fca3;
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(aMStack_88);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)aMStack_88,"/var/tmp/badfile.exr",iVar3);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012fa9f;
    }
    Imf_3_2::InputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::InputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::OutputFile]"
                   );
    }
    goto LAB_0012fc79;
  }
LAB_0012fa9f:
  Imf_3_2::InputFile::header();
  puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar1 = puVar7[1];
  if (sVar1 == inputtype->_M_string_length) {
    if (sVar1 == 0) goto LAB_0012fc79;
    iVar3 = bcmp((void *)*puVar7,(inputtype->_M_dataplus)._M_p,sVar1);
    if (iVar3 == 0) goto LAB_0012fc79;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," but got ",9);
  Imf_3_2::InputFile::header();
  puVar7 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)*puVar7,puVar7[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012fb7d;
    }
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
  }
  else {
LAB_0012fb7d:
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_0012fc79:
  Imf_3_2::InputFile::~InputFile((InputFile *)aMStack_88);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header(local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}